

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

bool __thiscall
Clasp::mt::ParallelSolve::SharedData::enterWait(SharedData *this,unique_lock<std::mutex> *lock)

{
  int iVar1;
  __int_type _Var2;
  __atomic_base<unsigned_int> *in_RSI;
  long in_RDI;
  bool bVar3;
  
  iVar1 = *(int *)(in_RDI + 0x130);
  _Var2 = std::__atomic_base::operator_cast_to_unsigned_int(in_RSI);
  bVar3 = iVar1 + 1U < _Var2;
  if (bVar3) {
    *(int *)(in_RDI + 0x130) = *(int *)(in_RDI + 0x130) + 1;
    std::condition_variable::wait((unique_lock *)(in_RDI + 0xe8));
    *(int *)(in_RDI + 0x130) = *(int *)(in_RDI + 0x130) + -1;
  }
  return bVar3;
}

Assistant:

bool enterWait(unique_lock<mutex>& lock) {
		assert(lock.owns_lock());
		if ((waiting + 1) >= threads)
			return false;
		++waiting;
		workCond.wait(lock);
		--waiting;
		return true;
	}